

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.H
# Opt level: O2

void __thiscall Fl_Window::border(Fl_Window *this,int b)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Fl_X *pFVar3;
  Fl_Widget *pFVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  Fl_Window *pFVar11;
  int iVar12;
  int iVar13;
  
  uVar8 = (this->super_Fl_Group).super_Fl_Widget.flags_;
  if (b == 0) {
    if ((uVar8 & 8) != 0) {
      return;
    }
    uVar8 = uVar8 | 8;
  }
  else {
    if ((uVar8 & 8) == 0) {
      return;
    }
    uVar8 = uVar8 & 0xfffffff7;
  }
  (this->super_Fl_Group).super_Fl_Widget.flags_ = uVar8;
  pFVar3 = this->i;
  if (pFVar3 == (Fl_X *)0x0) {
    return;
  }
  pFVar11 = pFVar3->w;
  if ((pFVar11->super_Fl_Group).super_Fl_Widget.parent_ != (Fl_Group *)0x0) {
    return;
  }
  if (((pFVar11->super_Fl_Group).super_Fl_Widget.flags_ & 0x100) != 0) {
    return;
  }
  if (pFVar11->size_range_set == '\0') {
    pFVar4 = (pFVar11->super_Fl_Group).resizable_;
    if (pFVar4 == (Fl_Widget *)0x0) {
      iVar9 = (pFVar11->super_Fl_Group).super_Fl_Widget.w_;
      iVar12 = (pFVar11->super_Fl_Group).super_Fl_Widget.h_;
      pFVar11->minw = iVar9;
      pFVar11->minh = iVar12;
      pFVar11->maxw = iVar9;
      pFVar11->maxh = iVar12;
      pFVar11->dw = 0;
      pFVar11->dh = 0;
    }
    else {
      uVar8 = pFVar4->w_;
      uVar7 = pFVar4->h_;
      uVar1 = (pFVar11->super_Fl_Group).super_Fl_Widget.w_;
      uVar2 = (pFVar11->super_Fl_Group).super_Fl_Widget.h_;
      pFVar11->minw =
           ((~-(uint)((int)uVar8 < 100) & 100 | uVar8 & -(uint)((int)uVar8 < 100)) - uVar8) + uVar1;
      pFVar11->minh =
           ((~-(uint)((int)uVar7 < 100) & 100 | uVar7 & -(uint)((int)uVar7 < 100)) - uVar7) + uVar2;
      pFVar11->maxw = 0;
      pFVar11->maxh = 0;
      pFVar11->dw = 0;
      pFVar11->dh = 0;
    }
    pFVar11->aspect = 0;
    size_range_(pFVar11);
    return;
  }
  pbVar10 = (byte *)XAllocSizeHints();
  pFVar11 = pFVar3->w;
  iVar9 = pFVar11->minw;
  *(int *)(pbVar10 + 0x18) = iVar9;
  iVar12 = pFVar11->minh;
  iVar5 = pFVar11->maxw;
  iVar13 = pFVar11->maxh;
  iVar6 = pFVar11->dw;
  *(int *)(pbVar10 + 0x1c) = iVar12;
  *(int *)(pbVar10 + 0x20) = iVar5;
  *(int *)(pbVar10 + 0x24) = iVar13;
  *(int *)(pbVar10 + 0x28) = iVar6;
  *(int *)(pbVar10 + 0x2c) = pFVar11->dh;
  pbVar10[0x48] = 10;
  pbVar10[0x49] = 0;
  pbVar10[0x4a] = 0;
  pbVar10[0x4b] = 0;
  if (iVar12 == iVar13 && iVar9 == iVar5) {
    pbVar10[0] = 0x30;
    pbVar10[1] = 2;
    pbVar10[2] = 0;
    pbVar10[3] = 0;
    pbVar10[4] = 0;
    pbVar10[5] = 0;
    pbVar10[6] = 0;
    pbVar10[7] = 0;
    goto LAB_001df527;
  }
  pbVar10[0] = 0x10;
  pbVar10[1] = 2;
  pbVar10[2] = 0;
  pbVar10[3] = 0;
  pbVar10[4] = 0;
  pbVar10[5] = 0;
  pbVar10[6] = 0;
  pbVar10[7] = 0;
  if (iVar5 < iVar9) {
    if (iVar12 <= iVar13) {
      pbVar10[0] = 0x30;
      pbVar10[1] = 2;
      pbVar10[2] = 0;
      pbVar10[3] = 0;
      pbVar10[4] = 0;
      pbVar10[5] = 0;
      pbVar10[6] = 0;
      pbVar10[7] = 0;
      iVar9 = Fl::w();
      *(int *)(pbVar10 + 0x20) = iVar9;
      iVar12 = *(int *)(pbVar10 + 0x1c);
      iVar13 = *(int *)(pbVar10 + 0x24);
      goto LAB_001df4ea;
    }
  }
  else {
    pbVar10[0] = 0x30;
    pbVar10[1] = 2;
    pbVar10[2] = 0;
    pbVar10[3] = 0;
    pbVar10[4] = 0;
    pbVar10[5] = 0;
    pbVar10[6] = 0;
    pbVar10[7] = 0;
LAB_001df4ea:
    if (iVar13 < iVar12) {
      iVar9 = Fl::h();
      *(int *)(pbVar10 + 0x24) = iVar9;
    }
  }
  if ((*(int *)(pbVar10 + 0x28) != 0) && (*(int *)(pbVar10 + 0x2c) != 0)) {
    *pbVar10 = *pbVar10 | 0x40;
  }
  pFVar11 = pFVar3->w;
  if (pFVar11->aspect != 0) {
    *(undefined4 *)(pbVar10 + 0x30) = *(undefined4 *)(pbVar10 + 0x18);
    *(undefined4 *)(pbVar10 + 0x34) = *(undefined4 *)(pbVar10 + 0x1c);
    *(undefined4 *)(pbVar10 + 0x38) = *(undefined4 *)(pbVar10 + 0x18);
    *(undefined4 *)(pbVar10 + 0x3c) = *(undefined4 *)(pbVar10 + 0x1c);
    *pbVar10 = *pbVar10 | 0x80;
  }
LAB_001df527:
  if (((pFVar11->super_Fl_Group).super_Fl_Widget.flags_ & 0x10) != 0) {
    *pbVar10 = *pbVar10 | 1;
    *(undefined8 *)(pbVar10 + 8) = *(undefined8 *)&(pFVar11->super_Fl_Group).super_Fl_Widget.x_;
  }
  XSetWMNormalHints(fl_display,pFVar3->xid,pbVar10);
  XChangeProperty(fl_display,pFVar3->xid,fl_MOTIF_WM_HINTS,fl_MOTIF_WM_HINTS,0x20,0);
  XFree(pbVar10);
  return;
}

Assistant:

unsigned int flags() const {return flags_;}